

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.c
# Opt level: O0

LY_ERR lyplg_type_compare_binary(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  int iVar1;
  lyd_value_binary *v2;
  lyd_value_binary *v1;
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  if ((*(long *)((long)&val1->field_2 + 8) == *(long *)((long)&val2->field_2 + 8)) &&
     (iVar1 = memcmp((val1->field_2).dyn_mem,(val2->field_2).dyn_mem,
                     *(size_t *)((long)&val1->field_2 + 8)), iVar1 == 0)) {
    return LY_SUCCESS;
  }
  return LY_ENOT;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_compare_binary(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    struct lyd_value_binary *v1, *v2;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    if ((v1->size != v2->size) || memcmp(v1->data, v2->data, v1->size)) {
        return LY_ENOT;
    }
    return LY_SUCCESS;
}